

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_LZWDecoder.hh
# Opt level: O1

void __thiscall Pl_LZWDecoder::~Pl_LZWDecoder(Pl_LZWDecoder *this)

{
  ~Pl_LZWDecoder(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~Pl_LZWDecoder() final = default;